

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O3

void test_AString_split_emptyString_fn(int _i)

{
  char *pcVar1;
  ASplittedString *splitted;
  char *pcVar2;
  char **ppcVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined8 uStack_50;
  AString string;
  
  string.reallocator = private_ACUtilsTest_AString_realloc;
  string.deallocator = private_ACUtilsTest_AString_free;
  string.size = 0;
  string.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x14e14c;
  string.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  *string.buffer = '\0';
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x14e175;
  splitted = AString_split(&string,';',false);
  if (string.capacity != 8) {
    pcVar5 = "(string).capacity == (8)";
    pcVar7 = "(string).capacity";
    iVar4 = 0x9e8;
    pcVar2 = (char *)string.capacity;
    goto LAB_0014e663;
  }
  uStack_50 = 0x14e197;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x9e8);
  if (string.buffer == (char *)0x0) {
    ppcVar3 = &local_58;
    pcVar5 = "Assertion \'_ck_x != NULL\' failed";
    pcVar2 = "Assertion \'%s\' failed: %s == %#x";
    pcVar7 = "(void*) (string).buffer != NULL";
    pcVar6 = "(void*) (string).buffer";
LAB_0014e4a7:
    iVar4 = 0x9e8;
    goto LAB_0014e748;
  }
  uStack_50 = 0x14e1b4;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x9e8);
  if (string.buffer == (char *)0x0) {
    pcVar2 = "(null)";
    pcVar5 = "";
  }
  else {
    if (*string.buffer == '\0') {
      uStack_50 = 0x14e1e4;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x9e8);
      if (string.size != 0) {
        ppcVar3 = &local_68;
        local_60 = "strlen(\"\")";
        local_68 = (char *)string.size;
        pcVar5 = "Assertion \'_ck_x == _ck_y\' failed";
        pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
        pcVar7 = "(string).size == strlen(\"\")";
        pcVar6 = "(string).size";
        goto LAB_0014e4a7;
      }
      uStack_50 = 0x14e203;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x9e8);
      if (splitted == (ASplittedString *)0x0) {
        ppcVar3 = &local_58;
        pcVar5 = "Assertion \'_ck_x != NULL\' failed";
        pcVar2 = "Assertion \'%s\' failed: %s == %#x";
        pcVar7 = "(void*) splitted != NULL";
        pcVar6 = "(void*) splitted";
        iVar4 = 0x9e9;
        goto LAB_0014e748;
      }
      uStack_50 = 0x14e21d;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x9e9);
      uStack_50 = 0x14e225;
      pcVar2 = (char *)private_ACUtils_ADynArray_size(splitted);
      if (pcVar2 != (char *)0x1) {
        local_60 = "1";
        pcVar5 = "private_ACUtils_ADynArray_size(splitted) == 1";
        pcVar7 = "private_ACUtils_ADynArray_size(splitted)";
        iVar4 = 0x9ea;
        local_58 = (char *)0x1;
        goto LAB_0014e66b;
      }
      uStack_50 = 0x14e240;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x9ea);
      pcVar2 = (char *)(*splitted->buffer)->capacity;
      if (pcVar2 != (char *)0x8) {
        pcVar5 = "(*(splitted->buffer[0])).capacity == (8)";
        pcVar7 = "(*(splitted->buffer[0])).capacity";
        iVar4 = 0x9eb;
LAB_0014e663:
        local_60 = "(8)";
        local_58 = (char *)0x8;
LAB_0014e66b:
        uStack_50 = 0;
        local_68 = pcVar2;
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,iVar4,"Assertion \'_ck_x == _ck_y\' failed",
                          "Assertion \'%s\' failed: %s == %ju, %s == %ju",pcVar5,pcVar7);
      }
      uStack_50 = 0x14e266;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x9eb);
      if ((*splitted->buffer)->buffer == (char *)0x0) {
        ppcVar3 = &local_58;
        pcVar5 = "Assertion \'_ck_x != NULL\' failed";
        pcVar2 = "Assertion \'%s\' failed: %s == %#x";
        pcVar7 = "(void*) (*(splitted->buffer[0])).buffer != NULL";
        pcVar6 = "(void*) (*(splitted->buffer[0])).buffer";
LAB_0014e62a:
        iVar4 = 0x9eb;
LAB_0014e748:
        uStack_50 = 0;
        local_58 = (char *)0x0;
        *(undefined8 *)((long)ppcVar3 + -8) = 0x14e74f;
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,iVar4,pcVar5,pcVar2,pcVar7,pcVar6);
      }
      uStack_50 = 0x14e289;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x9eb);
      pcVar2 = (*splitted->buffer)->buffer;
      if (pcVar2 == (char *)0x0) {
        pcVar2 = "(null)";
        pcVar5 = "";
      }
      else {
        if (*pcVar2 == '\0') {
          uStack_50 = 0x14e2bf;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x9eb);
          pcVar1 = (char *)(*splitted->buffer)->size;
          if (pcVar1 == (char *)0x0) {
            uStack_50 = 0x14e2e4;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x9eb);
            uStack_50 = 0x14e2ec;
            AString_freeSplitted(splitted);
            if (string.capacity == 8) {
              uStack_50 = 0x14e30c;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x9ed);
              if (string.buffer == (char *)0x0) {
                ppcVar3 = &local_58;
                pcVar5 = "Assertion \'_ck_x != NULL\' failed";
                pcVar2 = "Assertion \'%s\' failed: %s == %#x";
                pcVar7 = "(void*) (string).buffer != NULL";
                pcVar6 = "(void*) (string).buffer";
              }
              else {
                uStack_50 = 0x14e329;
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                            ,0x9ed);
                if (string.buffer == (char *)0x0) {
                  pcVar2 = "(null)";
                  pcVar5 = "";
LAB_0014e6b8:
                  uStack_50 = 0;
                  local_58 = "\"";
                  local_60 = "";
                  local_68 = "\"";
                  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                    ,0x9ed,
                                    "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                                    ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                                    "(string).buffer == (\"\")","(string).buffer",pcVar5,pcVar2,
                                    pcVar5,"(\"\")");
                }
                if (*string.buffer != '\0') {
                  pcVar5 = "\"";
                  pcVar2 = string.buffer;
                  goto LAB_0014e6b8;
                }
                uStack_50 = 0x14e359;
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                            ,0x9ed);
                if (string.size == 0) {
                  uStack_50 = 0x14e378;
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x9ed);
                  local_58 = (char *)private_ACUtilsTest_AString_freeCount;
                  if (private_ACUtilsTest_AString_reallocCount ==
                      private_ACUtilsTest_AString_freeCount) {
                    uStack_50 = 0x14e3a0;
                    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                ,0x9ee);
                    uStack_50 = 0x14e3a9;
                    (*string.deallocator)(string.buffer);
                    return;
                  }
                  pcVar5 = 
                  "private_ACUtilsTest_AString_reallocCount == (private_ACUtilsTest_AString_freeCount)"
                  ;
                  pcVar7 = "private_ACUtilsTest_AString_reallocCount";
                  iVar4 = 0x9ee;
                  local_60 = "(private_ACUtilsTest_AString_freeCount)";
                  pcVar2 = (char *)private_ACUtilsTest_AString_reallocCount;
                  goto LAB_0014e66b;
                }
                ppcVar3 = &local_68;
                local_60 = "strlen(\"\")";
                local_68 = (char *)string.size;
                pcVar5 = "Assertion \'_ck_x == _ck_y\' failed";
                pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                pcVar7 = "(string).size == strlen(\"\")";
                pcVar6 = "(string).size";
              }
              iVar4 = 0x9ed;
              goto LAB_0014e748;
            }
            pcVar5 = "(string).capacity == (8)";
            pcVar7 = "(string).capacity";
            iVar4 = 0x9ed;
            pcVar2 = (char *)string.capacity;
            goto LAB_0014e663;
          }
          ppcVar3 = &local_68;
          local_60 = "strlen(\"\")";
          pcVar5 = "Assertion \'_ck_x == _ck_y\' failed";
          pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
          pcVar7 = "(*(splitted->buffer[0])).size == strlen(\"\")";
          pcVar6 = "(*(splitted->buffer[0])).size";
          local_68 = pcVar1;
          goto LAB_0014e62a;
        }
        pcVar5 = "\"";
      }
      pcVar6 = "(*(splitted->buffer[0])).buffer == (\"\")";
      pcVar7 = "(void*) (*(splitted->buffer[0])).buffer";
      iVar4 = 0x9eb;
      goto LAB_0014e5d6;
    }
    pcVar5 = "\"";
    pcVar2 = string.buffer;
  }
  pcVar6 = "(string).buffer == (\"\")";
  pcVar7 = "(void*) (string).buffer";
  iVar4 = 0x9e8;
LAB_0014e5d6:
  uStack_50 = 0;
  local_58 = "\"";
  local_60 = "";
  local_68 = "\"";
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar4,
                    "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                    ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",pcVar6,pcVar7 + 8,pcVar5,
                    pcVar2,pcVar5,"(\"\")");
}

Assistant:

static struct AString private_ACUtilsTest_AString_constructTestString(const char *initBuffer, size_t capacity)
{
    bool tmp = private_ACUtilsTest_AString_reallocFail;
    struct AString string = {private_ACUtilsTest_AString_realloc, private_ACUtilsTest_AString_free};
    string.size = strlen(initBuffer);
    string.capacity = capacity;
    private_ACUtilsTest_AString_reallocFail = false;
    string.buffer = (char*) string.reallocator(nullptr, string.capacity + 1);
    private_ACUtilsTest_AString_reallocFail = tmp;
    private_ACUtilsTest_AString_reallocCount = 0;
    private_ACUtilsTest_AString_freeCount = 0;
    memcpy(string.buffer, initBuffer, string.size + 1); /* +1 for '\0' */
    return string;
}